

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O0

boolean tele_restrict(monst *mon)

{
  byte bVar1;
  char *pcVar2;
  monst *mon_local;
  
  if ((*(uint *)&(level->flags).field_0x8 >> 0xb & 1) == 0) {
    return '\0';
  }
  if (mon->wormno == '\0') {
    if ((viz_array[mon->my][mon->mx] & 2U) != 0) goto LAB_002fa7d7;
    if ((u.uprops[0x1e].intrinsic != 0) ||
       (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
        (((youmonst.data)->mflags1 & 0x1000) != 0)))) {
      if (ublindf == (obj *)0x0) {
        return '\x01';
      }
      if (ublindf->oartifact != '\x1d') {
        return '\x01';
      }
    }
    if (((u.uprops[0x40].intrinsic == 0) && (u.uprops[0x40].extrinsic == 0)) &&
       (((youmonst.data)->mflags3 & 0x100) == 0)) {
      return '\x01';
    }
    if ((mon->data->mflags3 & 0x200) == 0) {
      return '\x01';
    }
    bVar1 = viz_array[mon->my][mon->mx] & 1;
  }
  else {
    bVar1 = worm_known(level,mon);
  }
  if (bVar1 == 0) {
    return '\x01';
  }
LAB_002fa7d7:
  if (((((*(uint *)&mon->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
      ((u.uprops[0xc].extrinsic != 0 || (((youmonst.data)->mflags1 & 0x1000000) != 0)))) &&
     ((((*(uint *)&mon->field_0x60 >> 7 & 1) == 0 && ((*(uint *)&mon->field_0x60 >> 9 & 1) == 0)) &&
      (((byte)u._1052_1_ >> 5 & 1) == 0)))) {
    pcVar2 = mon_nam(mon);
    pline("A mysterious force prevents %s from teleporting!",pcVar2);
  }
  return '\x01';
}

Assistant:

boolean tele_restrict(struct monst *mon)
{
	if (level->flags.noteleport) {
		if (canseemon(level, mon))
		    pline("A mysterious force prevents %s from teleporting!",
			mon_nam(mon));
		return TRUE;
	}
	return FALSE;
}